

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

Expr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadSymbolicExpr_abi_cxx11_
          (Expr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this)

{
  char code;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  int opcode;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  Expr local_d0;
  Expr local_b0;
  LogicalExpr local_90;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  code = *pcVar1;
  if (code == 'o') {
    opcode = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
             ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this);
    if (opcode == 0x41) {
      ReadLogicalExpr_abi_cxx11_(&local_90,this);
      ReadSymbolicExpr_abi_cxx11_(&local_b0,this);
      ReadSymbolicExpr_abi_cxx11_(&local_d0,this);
      std::__cxx11::string::string(local_50,(string *)&local_90);
      std::__cxx11::string::string(local_70,(string *)&local_b0);
      std::__cxx11::string::string(local_30,(string *)&local_d0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      ReadNumericExpr_abi_cxx11_(__return_storage_ptr__,this,opcode);
    }
  }
  else if (code == 'h') {
    BinaryReader<mp::internal::EndiannessConverter>::ReadString(this_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ReadNumericExpr_abi_cxx11_(__return_storage_ptr__,this,code,false);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}